

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateBlockBuilder.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_5bee2::StateBlockBuilder::activate(StateBlockBuilder *this)

{
  shared_ptr<AppState> local_20;
  StateBlockBuilder *local_10;
  StateBlockBuilder *this_local;
  
  (this->super_AppState).m_completed = false;
  local_10 = this;
  std::shared_ptr<AppState>::shared_ptr(&local_20);
  std::shared_ptr<AppState>::operator=(&this->m_nextState,&local_20);
  std::shared_ptr<AppState>::~shared_ptr(&local_20);
  return true;
}

Assistant:

virtual bool activate() override
    {
        m_completed = false;
        m_nextState = {};
        return true;
    }